

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O0

void __thiscall QWidgetResizeHandler::setMouseCursor(QWidgetResizeHandler *this,MousePosition m)

{
  bool bVar1;
  qsizetype qVar2;
  QWidget *pQVar3;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  int i;
  QObjectList children;
  QObject *in_stack_ffffffffffffff48;
  QList<QObject_*> *in_stack_ffffffffffffff50;
  QWidget *in_stack_ffffffffffffff58;
  QCursor *in_stack_ffffffffffffff60;
  QCursor *cursor;
  QWidget *in_stack_ffffffffffffff68;
  int local_60;
  QCursor local_50;
  QCursor local_48;
  QCursor local_40;
  QCursor local_38;
  QCursor local_30;
  QCursor local_28;
  QList<QObject_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QObject::children((QObject *)0x668b65);
  QList<QObject_*>::QList(in_stack_ffffffffffffff50,(QList<QObject_*> *)in_stack_ffffffffffffff48);
  for (local_60 = 0; qVar2 = QList<QObject_*>::size(&local_20), local_60 < qVar2;
      local_60 = local_60 + 1) {
    QList<QObject_*>::at(in_stack_ffffffffffffff50,(qsizetype)in_stack_ffffffffffffff48);
    pQVar3 = qobject_cast<QWidget*>(in_stack_ffffffffffffff48);
    if ((pQVar3 != (QWidget *)0x0) &&
       (bVar1 = QWidget::testAttribute
                          (in_stack_ffffffffffffff58,
                           (WidgetAttribute)((ulong)in_stack_ffffffffffffff50 >> 0x20)), !bVar1)) {
      QCursor::QCursor(&local_28,ArrowCursor);
      QWidget::setCursor(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      QCursor::~QCursor(&local_28);
    }
  }
  switch(in_ESI) {
  case 1:
  case 2:
    QCursor::QCursor(&local_30,SizeFDiagCursor);
    QWidget::setCursor(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    QCursor::~QCursor(&local_30);
    break;
  case 3:
  case 4:
    pQVar3 = *(QWidget **)(in_RDI + 0x10);
    QCursor::QCursor(&local_38,SizeBDiagCursor);
    QWidget::setCursor(pQVar3,in_stack_ffffffffffffff60);
    QCursor::~QCursor(&local_38);
    break;
  case 5:
  case 6:
    cursor = *(QCursor **)(in_RDI + 0x10);
    QCursor::QCursor(&local_40,SizeVerCursor);
    QWidget::setCursor(in_stack_ffffffffffffff68,cursor);
    QCursor::~QCursor(&local_40);
    break;
  case 7:
  case 8:
    QCursor::QCursor(&local_48,SizeHorCursor);
    QWidget::setCursor(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    QCursor::~QCursor(&local_48);
    break;
  default:
    QCursor::QCursor(&local_50,ArrowCursor);
    QWidget::setCursor(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    QCursor::~QCursor(&local_50);
  }
  QList<QObject_*>::~QList((QList<QObject_*> *)0x668d8f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::setMouseCursor(MousePosition m)
{
#ifdef QT_NO_CURSOR
    Q_UNUSED(m);
#else
    QObjectList children = widget->children();
    for (int i = 0; i < children.size(); ++i) {
        if (QWidget *w = qobject_cast<QWidget*>(children.at(i))) {
            if (!w->testAttribute(Qt::WA_SetCursor)) {
                w->setCursor(Qt::ArrowCursor);
            }
        }
    }

    switch (m) {
    case TopLeft:
    case BottomRight:
        widget->setCursor(Qt::SizeFDiagCursor);
        break;
    case BottomLeft:
    case TopRight:
        widget->setCursor(Qt::SizeBDiagCursor);
        break;
    case Top:
    case Bottom:
        widget->setCursor(Qt::SizeVerCursor);
        break;
    case Left:
    case Right:
        widget->setCursor(Qt::SizeHorCursor);
        break;
    default:
        widget->setCursor(Qt::ArrowCursor);
        break;
    }
#endif // QT_NO_CURSOR
}